

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joystick.hpp
# Opt level: O0

void __thiscall Inputs::ConcreteJoystick::~ConcreteJoystick(ConcreteJoystick *this)

{
  ConcreteJoystick *this_local;
  
  (this->super_Joystick)._vptr_Joystick = (_func_int **)&PTR__ConcreteJoystick_00c98380;
  std::
  vector<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
  ::~vector(&this->stick_types_);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector
            (&this->inputs_);
  Inputs::Joystick::~Joystick(&this->super_Joystick);
  return;
}

Assistant:

ConcreteJoystick(const std::vector<Input> &inputs) : inputs_(inputs) {
			// Size and populate stick_types_, which is used for digital <-> analogue conversion.
			for(const auto &input: inputs_) {
				const bool is_digital_axis = input.is_digital_axis();
				const bool is_analogue_axis = input.is_analogue_axis();
				if(is_digital_axis || is_analogue_axis) {
					const size_t required_size = size_t(input.info.control.index+1);
					if(stick_types_.size() < required_size) {
						stick_types_.resize(required_size);
					}
					stick_types_[size_t(input.info.control.index)] = is_digital_axis ? StickType::Digital : StickType::Analogue;
				}
			}
		}